

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byteorder.c
# Opt level: O0

ExprInfo expr_info(List *expr,ByteOrder hint,ExprInfo *field_info)

{
  byte bVar1;
  List *ls;
  ByteOrder BVar2;
  BOOL BVar3;
  ByteSize BVar4;
  char *pcVar5;
  bool bVar6;
  ExprInfo EVar7;
  ulong local_1e8;
  BOOL local_1e0;
  ulong local_1c8;
  BOOL local_1c0;
  BOOL local_180;
  ByteOrder local_174;
  ExprInfo info2;
  int native;
  int big;
  List *l2;
  BOOL local_150;
  char local_138 [8];
  char buf [256];
  Token *t;
  ExprInfo *field_info_local;
  ByteOrder hint_local;
  List *expr_local;
  ByteSize BStack_10;
  ExprInfo info;
  
  memset((void *)((long)&expr_local + 4),0,0xc);
  if (expr != (List *)0x0) {
    buf._248_8_ = &expr->token;
    switch(((Token *)buf._248_8_)->type) {
    case TOK_FALSE:
    case TOK_TRUE:
      stack0xffffffffffffffec = 2;
      info.order = BO_UNKNOWN;
      break;
    default:
      pcVar5 = unparse_token((Token *)buf._248_8_,local_138);
      parse_error(expr,"byteorder.c: Don\'t know how to process endianness/byte size for %s.\n",
                  pcVar5);
      break;
    case TOK_DEFAULT:
      stack0xffffffffffffffec = 0x400000002;
      info.order = BO_UNKNOWN;
      break;
    case TOK_DOLLAR_DATA_REGISTER:
    case TOK_DOLLAR_ADDRESS_REGISTER:
    case TOK_DOLLAR_GENERAL_REGISTER:
      stack0xffffffffffffffec = (ulong)CONCAT14((expr->token).u.reginfo.size,2);
      info.order = (ByteOrder)(expr->token).u.reginfo.sgnd;
      break;
    case TOK_DOLLAR_AMODE:
    case TOK_DOLLAR_REVERSED_AMODE:
      stack0xffffffffffffffec = (ulong)CONCAT14((expr->token).u.reginfo.size,3);
      info.order = (ByteOrder)(expr->token).u.reginfo.sgnd;
      break;
    case TOK_DOLLAR_NUMBER:
      bVar1 = (expr->token).u.reginfo.size;
      stack0xffffffffffffffec =
           (ulong)CONCAT14(bVar1,field_info[(expr->token).u.reginfo.which].order);
      info.order = (ByteOrder)(expr->token).u.reginfo.sgnd;
      if ((field_info[(expr->token).u.reginfo.which].size != BS_UNKNOWN) &&
         (BStack_10 = (ByteSize)bVar1,
         bVar6 = field_info[(expr->token).u.reginfo.which].size != BStack_10, bVar6)) {
        pcVar5 = unparse_token((Token *)buf._248_8_,local_138);
        parse_error(expr,"Operand field %s defined with more than one different size! (%d/%d)\n",
                    pcVar5,(ulong)field_info[*(byte *)(buf._248_8_ + 10)].size,
                    (ulong)*(byte *)(buf._248_8_ + 9));
      }
      break;
    case TOK_DOLLAR_AMODE_PTR:
    case TOK_DOLLAR_REVERSED_AMODE_PTR:
      stack0xffffffffffffffec = 0x800000002;
      info.order = BO_DONT_CARE;
      break;
    case TOK_AMODE:
    case TOK_REVERSED_AMODE:
      stack0xffffffffffffffec = (ulong)CONCAT14((expr->token).u.reginfo.size,3);
      info.order = (ByteOrder)(expr->token).u.reginfo.sgnd;
      break;
    case TOK_QUOTED_STRING:
      stack0xffffffffffffffec = 0x400000002;
      info.order = BO_DONT_CARE;
      break;
    case TOK_NUMBER:
      stack0xffffffffffffffec = 2;
      info.order = BO_DONT_CARE;
      break;
    case TOK_DATA_REGISTER:
    case TOK_ADDRESS_REGISTER:
    case TOK_TEMP_REGISTER:
      stack0xffffffffffffffec = (ulong)CONCAT14((expr->token).u.reginfo.size,2);
      info.order = (ByteOrder)(expr->token).u.reginfo.sgnd;
      break;
    case TOK_CCC:
    case TOK_CCN:
    case TOK_CCV:
    case TOK_CCX:
    case TOK_CCNZ:
      stack0xffffffffffffffec = 2;
      info.order = BO_UNKNOWN;
      break;
    case TOK_CODE:
      stack0xffffffffffffffec = 0x800000002;
      info.order = BO_UNKNOWN;
      break;
    case TOK_LIST:
      ls = expr->car;
      buf._248_8_ = &ls->token;
      switch(((Token *)buf._248_8_)->type) {
      case TOK_IF:
      case TOK_SWITCH:
        break;
      case TOK_DEFAULT:
        stack0xffffffffffffffec = 0x400000002;
        info.order = BO_UNKNOWN;
        break;
      case TOK_AND:
      case TOK_OR:
      case TOK_XOR:
      case TOK_NOT:
      case TOK_EQUAL:
      case TOK_NOT_EQUAL:
      case TOK_GREATER_THAN:
      case TOK_LESS_THAN:
      case TOK_GREATER_OR_EQUAL:
      case TOK_LESS_OR_EQUAL:
        stack0xffffffffffffffec = 0x100000002;
        info.order = BO_UNKNOWN;
        break;
      default:
        pcVar5 = unparse_token((Token *)buf._248_8_,local_138);
        parse_error(ls,
                    "byteorder.c: Don\'t know how to process endianness/byte size for operator %s.\n"
                    ,pcVar5);
        break;
      case TOK_SHIFT_LEFT:
      case TOK_SHIFT_RIGHT:
        EVar7 = expr_info(ls->cdr,hint,field_info);
        local_150 = EVar7.sgnd;
        info.order = local_150;
        BStack_10 = EVar7.size;
        stack0xffffffffffffffec = CONCAT44(BStack_10,2);
        break;
      case TOK_ASSIGN:
        if (((((ls->cdr->token).type == TOK_CCC) || ((ls->cdr->token).type == TOK_CCN)) ||
            ((ls->cdr->token).type == TOK_CCV)) ||
           (((ls->cdr->token).type == TOK_CCX || ((ls->cdr->token).type == TOK_CCNZ)))) {
          EVar7 = expr_info(ls->cdr->cdr,hint,field_info);
          local_1c8 = EVar7._0_8_;
          local_1c0 = EVar7.sgnd;
          stack0xffffffffffffffec = local_1c8;
          info.order = local_1c0;
        }
        else {
          EVar7 = expr_info(ls->cdr,hint,field_info);
          local_1e8 = EVar7._0_8_;
          local_1e0 = EVar7.sgnd;
          stack0xffffffffffffffec = local_1e8;
          info.order = local_1e0;
        }
        break;
      case TOK_PLUS:
      case TOK_MINUS:
      case TOK_MULTIPLY:
      case TOK_DIVIDE:
      case TOK_MOD:
        stack0xffffffffffffffec = CONCAT44(BStack_10,2);
        BVar4 = expr_list_max_size(ls->cdr,hint,field_info);
        stack0xffffffffffffffec = CONCAT44(BVar4,expr_local._4_4_);
        BVar3 = expr_list_any_are_unsigned(ls->cdr,hint,field_info);
        info.order = (ByteOrder)((BVar3 != FALSE ^ 0xffU) & 1);
        break;
      case TOK_BITWISE_AND:
      case TOK_BITWISE_OR:
      case TOK_BITWISE_XOR:
      case TOK_BITWISE_NOT:
        info2.sgnd = FALSE;
        info2.size = BS_UNKNOWN;
        info.order = BO_DONT_CARE;
        for (_native = ls->cdr; _native != (List *)0x0; _native = _native->cdr) {
          if ((_native->token).type != TOK_NUMBER) {
            EVar7 = expr_info(_native,hint,field_info);
            local_180 = EVar7.sgnd;
            local_174 = EVar7.order;
            if (local_174 == BO_BIG_ENDIAN) {
              info2.sgnd = info2.sgnd + TRUE;
            }
            else if (local_174 == BO_NATIVE) {
              info2.size = info2.size + BS_BYTE;
            }
            if (local_180 == FALSE) {
              info.order = BO_UNKNOWN;
            }
          }
        }
        BVar2 = hint;
        if ((info2.sgnd != info2.size) && (BVar2 = BO_NATIVE, (int)info2.size < (int)info2.sgnd)) {
          BVar2 = BO_BIG_ENDIAN;
        }
        stack0xffffffffffffffec = CONCAT44(BStack_10,BVar2);
        BVar4 = expr_list_max_size(ls->cdr,hint,field_info);
        stack0xffffffffffffffec = CONCAT44(BVar4,expr_local._4_4_);
        break;
      case TOK_FUNC_CALL:
        stack0xffffffffffffffec = 0x400000002;
        info.order = BO_DONT_CARE;
        break;
      case TOK_CAST:
        stack0xffffffffffffffec = 2;
        info.order = BO_UNKNOWN;
        break;
      case TOK_DEREF:
        if ((ls->token).u.reginfo.size == '\0') {
          stack0xffffffffffffffec = 2;
          info.order = BO_UNKNOWN;
        }
        else {
          stack0xffffffffffffffec = (ulong)CONCAT14((ls->token).u.reginfo.size,3);
          info.order = (ByteOrder)(ls->token).u.reginfo.sgnd;
        }
        break;
      case TOK_SWAP:
        EVar7 = expr_info(ls->cdr,hint,field_info);
        expr_local._4_4_ = EVar7.order;
        if (expr_local._4_4_ == BO_BIG_ENDIAN) {
          expr_local._4_4_ = BO_NATIVE;
        }
        else if (expr_local._4_4_ == BO_NATIVE) {
          expr_local._4_4_ = BO_BIG_ENDIAN;
        }
        stack0xffffffffffffffec = (ulong)CONCAT14(*(undefined1 *)(buf._248_8_ + 9),expr_local._4_4_)
        ;
        info.order = (ByteOrder)*(byte *)(buf._248_8_ + 8);
        break;
      case TOK_EXPLICIT_LIST:
        break;
      case TOK_LIST:
      }
    }
  }
  EVar7.sgnd = info.order;
  EVar7.order = expr_local._4_4_;
  EVar7.size = BStack_10;
  return EVar7;
}

Assistant:

static ExprInfo
expr_info (const List *expr, ByteOrder hint, ExprInfo *field_info)
{
  ExprInfo info = { BO_UNKNOWN, BS_UNKNOWN, FALSE };   /* Defaults. */
  const Token *t;
  char buf[256];

  if (expr == NULL)
    return info;

  t = &expr->token;
  switch (t->type) {
  case TOK_DATA_REGISTER:
  case TOK_ADDRESS_REGISTER:
  case TOK_TEMP_REGISTER:
    info.order = BO_NATIVE;
    info.size  = t->u.reginfo.size;
    info.sgnd  = t->u.reginfo.sgnd;
    break;

  case TOK_DOLLAR_DATA_REGISTER:
  case TOK_DOLLAR_ADDRESS_REGISTER:
  case TOK_DOLLAR_GENERAL_REGISTER:
    info.order = BO_NATIVE;
    info.size  = t->u.dollarinfo.size;
    info.sgnd  = t->u.dollarinfo.sgnd;
    break;

  case TOK_DOLLAR_AMODE:              /* We assume that by the time we reach */
  case TOK_DOLLAR_REVERSED_AMODE:     /*  here, all reg amodes have been     */
    info.order = BO_BIG_ENDIAN;       /*  converted to dollar_reg's.         */
    info.size  = t->u.dollarinfo.size;
    info.sgnd  = t->u.dollarinfo.sgnd;
    break;

  case TOK_DOLLAR_AMODE_PTR:
  case TOK_DOLLAR_REVERSED_AMODE_PTR:
    info.order = BO_NATIVE;
    info.size  = sizeof (void *);
    info.sgnd  = TRUE;
    break;

  case TOK_AMODE:                     /* We assume that by the time we reach */
  case TOK_REVERSED_AMODE:            /*  here, all reg amodes have been     */
    info.order = BO_BIG_ENDIAN;       /*  converted to dollar_reg's.         */
    info.size  = t->u.amodeinfo.size;
    info.sgnd  = t->u.amodeinfo.sgnd;
    break;

  case TOK_CODE:
    info.order = BO_NATIVE;
    info.size  = sizeof (void *);
    info.sgnd  = FALSE;
    break;

  case TOK_NUMBER:
    info.order = BO_NATIVE;
    info.size  = BS_UNKNOWN;
    info.sgnd  = TRUE;
    break;

  case TOK_DEFAULT:
    info.order = BO_NATIVE;   /* So it's a legal case number. */
    info.size  = BS_LONG;
    info.sgnd  = FALSE;
    break;

  case TOK_CCC:
  case TOK_CCN:
  case TOK_CCV:
  case TOK_CCX:
  case TOK_CCNZ:
    info.order = BO_NATIVE;
#ifdef CCR_ELEMENT_8_BITS
    info.size  = BS_BYTE;
#else
    info.size  = BS_UNKNOWN;
#endif
    info.sgnd  = FALSE;
    break;

  case TOK_DOLLAR_NUMBER:
    info.order = field_info[t->u.dollarinfo.which].order;
    info.size  = t->u.dollarinfo.size;
    info.sgnd  = t->u.dollarinfo.sgnd;
    if (field_info[t->u.dollarinfo.which].size != BS_UNKNOWN
	&& field_info[t->u.dollarinfo.which].size != info.size)
      parse_error (expr, "Operand field %s defined with more than one "
		   "different size! (%d/%d)\n",
		   unparse_token (t, buf),
		   field_info[t->u.dollarinfo.which].size,
		   t->u.dollarinfo.size);
    break;

  case TOK_FALSE:
  case TOK_TRUE:
    info.order = BO_NATIVE;
    info.size  = BS_UNKNOWN;
    info.sgnd  = NO;
    break;

  case TOK_QUOTED_STRING:
    info.order = BO_NATIVE;
    info.size  = BS_LONG;  /* Who knows what is appropriate here. */
    info.sgnd  = TRUE;     /* Sure, why not. */
    break;

  case TOK_LIST:
    expr = expr->car;
    t = &expr->token;
    switch (t->type) {
    case TOK_PLUS:
    case TOK_MINUS:
    case TOK_MULTIPLY:
    case TOK_DIVIDE:
    case TOK_MOD:
      info.order = BO_NATIVE;
      info.size  = expr_list_max_size (expr->cdr, hint, field_info);
      info.sgnd  = !expr_list_any_are_unsigned (expr->cdr, hint, field_info);
      break;

    case TOK_SHIFT_LEFT:
    case TOK_SHIFT_RIGHT:
      info = expr_info (expr->cdr, hint, field_info);  /* Get defaults. */
      info.order = BO_NATIVE;
      break;

    case TOK_BITWISE_AND:
    case TOK_BITWISE_OR:
    case TOK_BITWISE_XOR:
    case TOK_BITWISE_NOT:
      {
	List *l2;
	int big = 0, native = 0;
	info.sgnd = TRUE;
	for (l2 = expr->cdr; l2 != NULL; l2 = l2->cdr)
	  {
	    if (l2->token.type != TOK_NUMBER)
	      {
		ExprInfo info2 = expr_info (l2, hint, field_info);
		if (info2.order == BO_BIG_ENDIAN)
		  big++;
		else if (info2.order == BO_NATIVE)
		  native++;
		if (!info2.sgnd)
		  info.sgnd = FALSE;
	      }
	  }
	if (big == native)  /* Tie?  Then stick with the hint. */
	  info.order = hint;
	else info.order = (big > native) ? BO_BIG_ENDIAN : BO_NATIVE;
	info.size = expr_list_max_size (expr->cdr, hint, field_info);
      }
      break;

    case TOK_SWAP:
      info = expr_info (expr->cdr, hint, field_info);
      if (info.order == BO_BIG_ENDIAN)
	info.order = BO_NATIVE;
      else if (info.order == BO_NATIVE)
	info.order = BO_BIG_ENDIAN;
      info.size = t->u.swapinfo.size;
      info.sgnd = t->u.swapinfo.sgnd;
      break;

    case TOK_LIST:
      /* Stick with "unknown" default. */
      break;

    case TOK_ASSIGN:
#ifndef CCR_ELEMENT_8_BITS
      if (IS_CCBIT_TOKEN (expr->cdr->token.type))
	{
	  info = expr_info (CDDR (expr), hint, field_info);   /* rhs */
	}
      else
#endif
	{
	  info = expr_info (expr->cdr, hint, field_info);     /* lhs */
	}
      break;

    case TOK_CAST:
      info.order = BO_NATIVE;
      info.size  = BS_UNKNOWN;
      info.sgnd = FALSE;  /* Who knows? */
      break;

    case TOK_DEREF:
      if (t->u.derefinfo.size == 0)
	{
	  info.order = BO_NATIVE;
	  info.size  = BS_UNKNOWN;
	  info.sgnd  = FALSE;  /* Who knows? */
	}
      else
	{
	  info.order = BO_BIG_ENDIAN;
	  info.size  = t->u.derefinfo.size;
	  info.sgnd  = t->u.derefinfo.sgnd;
	}
      break;

    case TOK_EQUAL:
    case TOK_NOT_EQUAL:
    case TOK_GREATER_THAN:
    case TOK_LESS_THAN:
    case TOK_GREATER_OR_EQUAL:
    case TOK_LESS_OR_EQUAL:
    case TOK_AND:
    case TOK_OR:
    case TOK_XOR:
    case TOK_NOT:
      info.order = BO_NATIVE;
      info.size  = BS_BYTE;
      info.sgnd  = FALSE;
      break;

    case TOK_SWITCH:
    case TOK_IF:
      break;

    case TOK_DEFAULT:
      info.order = BO_NATIVE;   /* So it's a legal case number. */
      info.size  = BS_LONG;
      info.sgnd  = FALSE;
      break;

    case TOK_EXPLICIT_LIST:   /* Unknown everything. */
      break;

    case TOK_FUNC_CALL:
      info.order = BO_NATIVE;
      info.size  = BS_LONG;
      info.sgnd  = TRUE;  /* Who knows? */
      break;
      
    default:
      parse_error (expr, "byteorder.c: Don't know how to process "
		   "endianness/byte size for operator %s.\n",
		   unparse_token (t, buf));
      break;
    }
    break;

  default:
    parse_error (expr, "byteorder.c: Don't know how to process "
		 "endianness/byte size for %s.\n", unparse_token (t, buf));
    break;
  }

  return info;
}